

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_state.cpp
# Opt level: O0

uint lzham::get_huge_match_code_len(uint len)

{
  uint uVar1;
  uint len_local;
  undefined4 local_4;
  
  uVar1 = len - 0x102;
  if (uVar1 < 0x100) {
    local_4 = 9;
  }
  else if (uVar1 < 0x500) {
    local_4 = 0xc;
  }
  else if (uVar1 < 0x1500) {
    local_4 = 0xf;
  }
  else {
    local_4 = 0x13;
  }
  return local_4;
}

Assistant:

static uint get_huge_match_code_len(uint len)
   {
      LZHAM_ASSERT((len > CLZBase::cMaxMatchLen) && (len <= CLZBase::cMaxHugeMatchLen));
      len -= (CLZBase::cMaxMatchLen + 1);

      if (len < 256)
         return 1 + 8;
      else if (len < (256 + 1024))
         return 2 + 10;
      else if (len < (256 + 1024 + 4096))
         return 3 + 12;
      else
         return 3 + 16;
   }